

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::sampleMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *bitfield,int numBits)

{
  int wordNdx;
  long lVar1;
  long lVar2;
  uint uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)bitfield);
  lVar1 = 0;
  do {
    if ((int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2) <= lVar1) {
      return __return_storage_ptr__;
    }
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      uVar3 = ~((uint)lVar2 | (uint)(lVar1 << 5)) + (int)bitfield;
      if ((int)uVar3 < 0) {
        return __return_storage_ptr__;
      }
      if ((*(uint *)(*(long *)this + lVar1 * 4) >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = '1';
      }
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static std::string sampleMaskToString (const std::vector<deUint32>& bitfield, int numBits)
{
	std::string result(numBits, '0');

	// move from back to front and set chars to 1
	for (int wordNdx = 0; wordNdx < (int)bitfield.size(); ++wordNdx)
	{
		for (int bit = 0; bit < 32; ++bit)
		{
			const int targetCharNdx = numBits - (wordNdx*32+bit) - 1;

			// beginning of the string reached
			if (targetCharNdx < 0)
				return result;

			if ((bitfield[wordNdx] >> bit) & 0x01)
				result[targetCharNdx] = '1';
		}
	}

	return result;
}